

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsValueRef
WScriptJsrt::ReadLineStdinCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  int iVar1;
  int iVar2;
  JsErrorCode JVar3;
  PAL_FILE *file;
  char *pcVar4;
  long lVar5;
  char *__ptr;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  JsValueRef local_38;
  JsValueRef emptyStringObject;
  JsValueRef stringObject;
  
  iVar9 = 0;
  file = PAL_get_stdin(0);
  pcVar4 = (char *)malloc(0x100);
  if (pcVar4 == (char *)0x0) {
    __ptr = (char *)0x0;
  }
  else {
    iVar8 = 0x100;
    while (__ptr = pcVar4, iVar2 = JsFgets(__ptr + iVar9,iVar8 - iVar9,file), 0 < iVar2) {
      iVar6 = iVar2 + iVar9 + -2;
      lVar7 = (long)iVar6;
      iVar1 = iVar2 + -1 + iVar9;
      lVar5 = (long)iVar1;
      if ((__ptr[lVar7] == '\r') && (__ptr[lVar5] == '\n')) {
        __ptr[lVar5] = '\0';
LAB_00110e46:
        iVar9 = iVar6;
        __ptr[lVar7] = '\0';
        break;
      }
      lVar7 = lVar5;
      iVar6 = iVar1;
      if (__ptr[lVar5] == '\n') goto LAB_00110e46;
      iVar9 = iVar9 + iVar2;
      if (iVar9 < iVar8 + -1) break;
      iVar8 = iVar8 * 2;
      if ((iVar8 <= iVar9) || (pcVar4 = (char *)realloc(__ptr,(long)iVar8), pcVar4 == (char *)0x0))
      goto LAB_00110ea1;
    }
    if (iVar9 == 0) {
      iVar9 = PAL_feof(file);
      if ((iVar9 == 0) &&
         (JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)(__ptr,0,&local_38),
         JVar3 == JsNoError)) {
        free(__ptr);
        return local_38;
      }
    }
    else {
      JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                        (__ptr,(long)iVar9,&emptyStringObject);
      if (JVar3 == JsNoError) {
        free(__ptr);
        return emptyStringObject;
      }
    }
  }
LAB_00110ea1:
  free(__ptr);
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::ReadLineStdinCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    const int BUFSIZE = 256;
    FILE* from = stdin;
    int buflength = 0;
    int bufsize = BUFSIZE;
    char* buf = static_cast<char*>(malloc(bufsize));
    char* tmp;
    int gotlength = 0;

    if (!buf)
    {
        goto Error;
    }

    while ((gotlength = JsFgets(buf + buflength, bufsize - buflength, from)) > 0) 
    {
        buflength += gotlength;

        // are we done?
        if (buf[buflength - 2] == '\r' && buf[buflength - 1] == '\n') 
        {
            buf[buflength - 1] = '\0';
            buf[buflength - 2] = '\0';
            buflength -= 2;
            break;
        }
        else if (buf[buflength - 1] == '\n') 
        {
            buf[buflength - 1] = '\0';
            buflength -= 1;
            break;
        }
        else if (buflength < bufsize - 1) 
        {
            break;
        }

        // Else, grow our buffer for another pass.
        bufsize *= 2;
        if (bufsize > buflength) 
        {
            tmp = static_cast<char*>(realloc(buf, bufsize));
        }
        else 
        {
            goto Error;
        }

        if (!tmp) 
        {
            goto Error;
        }

        buf = tmp;
    }

    //Treat the empty string specially.
    if (buflength == 0) 
    {
        if (feof(from)) 
        {
            goto Error;
        }
        else 
        {
            JsValueRef emptyStringObject;
            IfJsrtErrorSetGo(ChakraRTInterface::JsCreateString(buf, buflength, &emptyStringObject));
            free(buf);
            return emptyStringObject;
        }
    }

   
    // Turn buf into a JSString. Note that buflength includes the trailing null character.
    JsValueRef stringObject;
    IfJsrtErrorSetGo(ChakraRTInterface::JsCreateString(buf, buflength, &stringObject));
    free(buf);
    return stringObject;

Error:
    if (buf)
    {
        free(buf);
    }
    return returnValue;
}